

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O3

t_object * __thiscall
xemmai::t_heap<xemmai::t_object>::t_of<3UL,_1024UL>::f_grow
          (t_of<3UL,_1024UL> *this,t_heap<xemmai::t_object> *a_heap)

{
  pthread_mutex_t *__mutex;
  t_object *ptVar1;
  t_object *ptVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  unsigned_long length;
  t_object *local_28;
  unsigned_long local_20;
  
  local_20 = 0x100000;
  local_28 = (t_object *)f_map(0x100000);
  lVar5 = 0x3ff;
  ptVar2 = local_28;
  do {
    ptVar1 = ptVar2;
    ptVar1->v_count = 1;
    ptVar1->v_next = ptVar1 + 8;
    ptVar1->v_rank = 3;
    lVar5 = lVar5 + -1;
    ptVar2 = ptVar1 + 8;
  } while (lVar5 != 0);
  ptVar1[8].v_count = 1;
  ptVar1[8].v_rank = 3;
  local_28->v_cyclic = 0x400;
  __mutex = (pthread_mutex_t *)(a_heap + 0x38);
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    std::
    _Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,unsigned_long>,std::_Select1st<std::pair<xemmai::t_object*const,unsigned_long>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
    ::_M_emplace_unique<xemmai::t_object*&,unsigned_long&>
              ((_Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,unsigned_long>,std::_Select1st<std::pair<xemmai::t_object*const,unsigned_long>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
                *)(a_heap + 8),&local_28,&local_20);
    pthread_mutex_unlock(__mutex);
    LOCK();
    (this->v_grown).super___atomic_base<unsigned_long>._M_i =
         (this->v_grown).super___atomic_base<unsigned_long>._M_i + 0x400;
    UNLOCK();
    (**(code **)a_heap)();
    return local_28;
  }
  uVar4 = std::__throw_system_error(iVar3);
  pthread_mutex_unlock(__mutex);
  _Unwind_Resume(uVar4);
}

Assistant:

T* f_grow(t_heap& a_heap)
		{
			auto size = c_UNIT << A_rank;
			auto length = size * A_size;
			auto block = static_cast<char*>(f_map(length));
			auto p = block;
			for (size_t i = 1; i < A_size; ++i) {
				auto q = new(p) T;
				q->v_next = reinterpret_cast<T*>(p += size);
				q->v_rank = A_rank;
			}
			auto q = new(p) T;
			q->v_rank = A_rank;
			q = reinterpret_cast<T*>(block);
			q->v_cyclic = A_size;
			{
				std::lock_guard lock(a_heap.v_mutex);
				a_heap.v_blocks.emplace(q, length);
			}
			v_grown.fetch_add(A_size, std::memory_order_relaxed);
			a_heap.v_tick();
			return q;
		}